

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QTabBarPrivate::Tab_*>::move(QList<QTabBarPrivate::Tab_*> *this,qsizetype from,qsizetype to)

{
  long lVar1;
  long lVar2;
  Tab **ppTVar3;
  Tab **ppTVar4;
  
  if (from == to) {
    return;
  }
  detach(this);
  ppTVar3 = (this->d).ptr;
  if (from < to) {
    lVar1 = from * 8;
    ppTVar4 = ppTVar3 + from + 1;
    lVar2 = to * 8;
  }
  else {
    lVar1 = to * 8;
    ppTVar4 = ppTVar3 + from;
    lVar2 = from * 8;
  }
  std::_V2::__rotate<QTabBarPrivate::Tab**>((long)ppTVar3 + lVar1,ppTVar4,(long)ppTVar3 + lVar2 + 8)
  ;
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }